

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

size_t propagatemark(global_State *g)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  GCtab *in_RDI;
  GCtrace *T;
  lua_State *th;
  GCproto *pt;
  GCfunc *fn;
  GCtab *t;
  int gct;
  GCobj *o;
  GCfunc *in_stack_ffffffffffffff98;
  global_State *in_stack_ffffffffffffffa0;
  GCtrace *in_stack_ffffffffffffffa8;
  global_State *in_stack_ffffffffffffffb0;
  global_State *in_stack_fffffffffffffff8;
  
  uVar2 = in_RDI[3].array.ptr32;
  uVar5 = (ulong)uVar2;
  cVar1 = *(char *)(uVar5 + 5);
  *(byte *)(uVar5 + 4) = *(byte *)(uVar5 + 4) | 4;
  in_RDI[3].array.ptr32 = *(uint32_t *)(uVar5 + 0xc);
  if (cVar1 == '\v') {
    iVar3 = gc_traverse_tab(in_stack_fffffffffffffff8,in_RDI);
    if (0 < iVar3) {
      *(byte *)(uVar5 + 4) = *(byte *)(uVar5 + 4) & 0xfb;
    }
    if (*(int *)(uVar5 + 0x1c) == 0) {
      lVar4 = 0;
    }
    else {
      lVar4 = (ulong)(*(int *)(uVar5 + 0x1c) + 1) * 0x18;
    }
    uVar5 = (ulong)*(uint *)(uVar5 + 0x18) * 8 + 0x20 + lVar4;
  }
  else if (cVar1 == '\b') {
    gc_traverse_func(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (*(char *)(uVar5 + 6) == '\0') {
      uVar5 = (ulong)*(byte *)(uVar5 + 7) * 4 + 0x14;
    }
    else {
      uVar5 = (ulong)*(byte *)(uVar5 + 7) * 8 + 0x20;
    }
  }
  else if (cVar1 == '\a') {
    gc_traverse_proto(in_stack_ffffffffffffffa0,(GCproto *)&in_stack_ffffffffffffff98->c);
    uVar5 = (ulong)*(uint *)(uVar5 + 0x20);
  }
  else if (cVar1 == '\x06') {
    *(uint32_t *)(uVar5 + 0xc) = in_RDI[3].gclist.gcptr32;
    in_RDI[3].gclist.gcptr32 = uVar2;
    *(byte *)(uVar5 + 4) = *(byte *)(uVar5 + 4) & 0xfb;
    gc_traverse_thread(in_stack_ffffffffffffffb0,(lua_State *)in_stack_ffffffffffffffa8);
    uVar5 = (ulong)*(uint *)(uVar5 + 0x38) * 8 + 0x40;
  }
  else {
    gc_traverse_trace(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    uVar5 = (ulong)(uint)(*(int *)(uVar5 + 8) - *(int *)(uVar5 + 0x18)) * 8 + 0x60 +
            (ulong)*(ushort *)(uVar5 + 6) * 0xc + (ulong)*(uint *)(uVar5 + 0x1c) * 4;
  }
  return uVar5;
}

Assistant:

static size_t propagatemark(global_State *g)
{
  GCobj *o = gcref(g->gc.gray);
  int gct = o->gch.gct;
  lj_assertG(isgray(o), "propagation of non-gray object");
  gray2black(o);
  setgcrefr(g->gc.gray, o->gch.gclist);  /* Remove from gray list. */
  if (LJ_LIKELY(gct == ~LJ_TTAB)) {
    GCtab *t = gco2tab(o);
    if (gc_traverse_tab(g, t) > 0)
      black2gray(o);  /* Keep weak tables gray. */
    return sizeof(GCtab) + sizeof(TValue) * t->asize +
			   (t->hmask ? sizeof(Node) * (t->hmask + 1) : 0);
  } else if (LJ_LIKELY(gct == ~LJ_TFUNC)) {
    GCfunc *fn = gco2func(o);
    gc_traverse_func(g, fn);
    return isluafunc(fn) ? sizeLfunc((MSize)fn->l.nupvalues) :
			   sizeCfunc((MSize)fn->c.nupvalues);
  } else if (LJ_LIKELY(gct == ~LJ_TPROTO)) {
    GCproto *pt = gco2pt(o);
    gc_traverse_proto(g, pt);
    return pt->sizept;
  } else if (LJ_LIKELY(gct == ~LJ_TTHREAD)) {
    lua_State *th = gco2th(o);
    setgcrefr(th->gclist, g->gc.grayagain);
    setgcref(g->gc.grayagain, o);
    black2gray(o);  /* Threads are never black. */
    gc_traverse_thread(g, th);
    return sizeof(lua_State) + sizeof(TValue) * th->stacksize;
  } else {
#if LJ_HASJIT
    GCtrace *T = gco2trace(o);
    gc_traverse_trace(g, T);
    return ((sizeof(GCtrace)+7)&~7) + (T->nins-T->nk)*sizeof(IRIns) +
	   T->nsnap*sizeof(SnapShot) + T->nsnapmap*sizeof(SnapEntry);
#else
    lj_assertG(0, "bad GC type %d", gct);
    return 0;
#endif
  }
}